

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

void sect_Skip(uint32_t skip,bool ds)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (currentSection == (Section *)0x0) {
    error("Cannot output data outside of a SECTION\n");
    return;
  }
  bVar1 = reserveSpace(skip);
  if (bVar1) {
    if (currentSection->type == SECTTYPE_INVALID) {
      __assert_fail("type != SECTTYPE_INVALID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                    ,0x65,"bool sect_HasData(enum SectionType)");
    }
    if ((currentSection->type & ~SECTTYPE_VRAM) != SECTTYPE_ROMX) {
      growSection(skip);
      return;
    }
    if (!ds) {
      pcVar2 = "DB";
      if (skip == 2) {
        pcVar2 = "DW";
      }
      pcVar3 = "DL";
      if (skip != 4) {
        pcVar3 = pcVar2;
      }
      warning(WARNING_EMPTY_DATA_DIRECTIVE,"%s directive without data in ROM\n",pcVar3);
    }
    if (skip != 0) {
      do {
        currentSection->data[loadOffset + curOffset] = fillByte;
        growSection(1);
        skip = skip - 1;
      } while (skip != 0);
    }
  }
  return;
}

Assistant:

static bool checksection(void)
{
	if (currentSection)
		return true;

	error("Cannot output data outside of a SECTION\n");
	return false;
}